

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Kernel::clear_kernel(Kernel *this)

{
  KernelCase KVar1;
  Kernel *this_local;
  
  KVar1 = kernel_case(this);
  switch(KVar1) {
  case KERNEL_NOT_SET:
    break;
  case kLinearKernel:
    if ((this->kernel_).linearkernel_ != (LinearKernel *)0x0) {
      (*(((this->kernel_).linearkernel_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kRbfKernel:
    if ((this->kernel_).linearkernel_ != (LinearKernel *)0x0) {
      (*(((this->kernel_).linearkernel_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kPolyKernel:
    if ((this->kernel_).linearkernel_ != (LinearKernel *)0x0) {
      (*(((this->kernel_).linearkernel_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kSigmoidKernel:
    if ((this->kernel_).linearkernel_ != (LinearKernel *)0x0) {
      (*(((this->kernel_).linearkernel_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Kernel::clear_kernel() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Kernel)
  switch (kernel_case()) {
    case kLinearKernel: {
      delete kernel_.linearkernel_;
      break;
    }
    case kRbfKernel: {
      delete kernel_.rbfkernel_;
      break;
    }
    case kPolyKernel: {
      delete kernel_.polykernel_;
      break;
    }
    case kSigmoidKernel: {
      delete kernel_.sigmoidkernel_;
      break;
    }
    case KERNEL_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = KERNEL_NOT_SET;
}